

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arun.cpp
# Opt level: O3

transformation_t *
opengv::math::arun_complete(transformation_t *__return_storage_ptr__,points_t *p1,points_t *p2)

{
  long *plVar1;
  undefined1 (*pauVar2) [64];
  undefined8 *puVar3;
  double dVar4;
  undefined8 uVar5;
  pointer pMVar6;
  pointer pMVar7;
  byte bVar8;
  bool bVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  Index size;
  long lVar13;
  ActualDstType actualDst;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  pointer pMVar17;
  double *pdVar18;
  ulong uVar19;
  Index outer;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM5 [64];
  MatrixXd Hcross;
  rotation_t rotation;
  Vector3d f;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  double local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  long lStack_88;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  double local_38;
  
  local_b8._8_8_ = local_b8._0_8_;
  auVar22 = in_ZMM5._0_16_;
  pMVar17 = (p1->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (p1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pMVar7 = (p2->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar20 = ((long)pMVar6 - (long)pMVar17 >> 3) * -0x5555555555555555;
  if (pMVar6 == pMVar17) {
    local_d8 = 0.0;
    local_f0 = 0.0;
    auVar30 = ZEXT816(0);
    local_c8._0_8_ = 0.0;
    local_c8._8_8_ = 0.0;
  }
  else {
    local_c8._0_8_ = 0.0;
    local_c8._8_8_ = 0.0;
    local_d8 = 0.0;
    lVar15 = 0x10;
    local_f0 = 0.0;
    lVar13 = lVar20 + (ulong)(lVar20 == 0);
    auVar32 = ZEXT816(0);
    do {
      pdVar18 = (double *)
                ((long)(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + lVar15 + -0x10);
      local_c8._0_8_ = (double)local_c8._0_8_ + *pdVar18;
      local_c8._8_8_ = (double)local_c8._8_8_ + pdVar18[1];
      local_f0 = local_f0 +
                 *(double *)
                  ((long)(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data.array + lVar15);
      pdVar18 = (double *)
                ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar15 + -0x10);
      auVar30._0_8_ = auVar32._0_8_ + *pdVar18;
      auVar30._8_8_ = auVar32._8_8_ + pdVar18[1];
      local_d8 = local_d8 +
                 *(double *)
                  ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + lVar15);
      lVar15 = lVar15 + 0x18;
      lVar13 = lVar13 + -1;
      auVar32 = auVar30;
    } while (lVar13 != 0);
  }
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  auVar32 = vcvtusi2sd_avx512f(auVar22,((long)(p2->
                                              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pMVar7 >> 3) * -0x5555555555555555);
  dVar28 = auVar32._0_8_;
  auVar32._8_8_ = dVar28;
  auVar32._0_8_ = dVar28;
  local_d8 = local_d8 / dVar28;
  local_e8 = vdivpd_avx(auVar30,auVar32);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
  local_b8._0_8_ = lVar20;
  if ((local_108.m_rows == 3) && (local_108.m_cols == 3)) {
    uVar21 = 9;
    uVar14 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
    uVar21 = local_108.m_cols * local_108.m_rows;
    uVar14 = uVar21 + 7;
    if (-1 < (long)uVar21) {
      uVar14 = uVar21;
    }
    uVar14 = uVar14 & 0xfffffffffffffff8;
    pdVar18 = local_108.m_data;
    if ((long)uVar21 < 8) goto LAB_00245ac8;
  }
  pdVar18 = local_108.m_data;
  uVar16 = 8;
  if (8 < (long)uVar14) {
    uVar16 = uVar14;
  }
  memset(local_108.m_data,0,uVar16 * 8);
LAB_00245ac8:
  auVar22 = vcvtusi2sd_avx512f(auVar22,local_b8._0_8_);
  dVar28 = auVar22._0_8_;
  auVar31._8_8_ = dVar28;
  auVar31._0_8_ = dVar28;
  if (uVar21 - uVar14 != 0 && (long)uVar14 <= (long)uVar21) {
    local_b8 = auVar22;
    local_58 = auVar31;
    memset(pdVar18 + uVar14,0,(uVar21 - uVar14) * 8);
    auVar31 = local_58;
    dVar28 = (double)local_b8._0_8_;
  }
  pMVar17 = (p1->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_c8 = vdivpd_avx(local_c8,auVar31);
  local_f0 = local_f0 / dVar28;
  if ((p1->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar17) {
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar21 = local_108.m_cols * local_108.m_rows;
    uVar14 = uVar21 + 7;
    if (-1 < (long)uVar21) {
      uVar14 = uVar21;
    }
    uVar16 = 0;
    lVar20 = (long)uVar14 >> 3;
    auVar24 = vpbroadcastq_avx512f();
    do {
      local_48 = vsubpd_avx(*(undefined1 (*) [16])
                             pMVar17[uVar16].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array,local_c8);
      local_38 = pMVar17[uVar16].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2] - local_f0;
      pMVar17 = (p2->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      dVar28 = *(double *)
                ((long)&pMVar17[uVar16].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        .m_storage.m_data + 0x10);
      lVar13 = 0;
      auVar22 = vsubpd_avx(*(undefined1 (*) [16])
                            &pMVar17[uVar16].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data,local_e8);
      pdVar18 = (double *)(local_a8 + 0x10);
      do {
        dVar4 = *(double *)(local_48 + lVar13 * 8);
        lVar13 = lVar13 + 1;
        pdVar18[-2] = auVar22._0_8_ * dVar4;
        pdVar18[-1] = auVar22._8_8_ * dVar4;
        *pdVar18 = (dVar28 - local_d8) * dVar4;
        pdVar18 = pdVar18 + 3;
      } while (lVar13 != 3);
      if (7 < (long)uVar21) {
        lVar13 = 0;
        do {
          auVar25 = vaddpd_avx512f(*(undefined1 (*) [64])(local_a8 + lVar13 * 8),
                                   *(undefined1 (*) [64])(local_108.m_data + lVar13));
          *(undefined1 (*) [64])(local_108.m_data + lVar13) = auVar25;
          lVar13 = lVar13 + 8;
        } while (lVar13 < (long)(uVar14 & 0xfffffffffffffff8));
      }
      if ((long)uVar21 % 8 != 0 && (long)(uVar14 & 0xfffffffffffffff8) <= (long)uVar21) {
        uVar19 = 0;
        do {
          auVar25 = vpbroadcastq_avx512f();
          auVar25 = vporq_avx512f(auVar25,auVar23);
          uVar10 = vpcmpuq_avx512f(auVar25,auVar24,2);
          plVar1 = (long *)(local_a8 + uVar19 * 8 + lVar20 * 0x40);
          bVar8 = (byte)uVar10;
          auVar25._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * plVar1[1];
          auVar25._0_8_ = (ulong)(bVar8 & 1) * *plVar1;
          auVar25._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * plVar1[2];
          auVar25._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * plVar1[3];
          auVar25._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * plVar1[4];
          auVar25._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * plVar1[5];
          auVar25._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * plVar1[6];
          auVar25._56_8_ = (uVar10 >> 7) * plVar1[7];
          pdVar18 = local_108.m_data + lVar20 * 8 + uVar19;
          auVar26._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar18[1];
          auVar26._0_8_ = (ulong)(bVar8 & 1) * (long)*pdVar18;
          auVar26._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar18[2];
          auVar26._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar18[3];
          auVar26._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar18[4];
          auVar26._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar18[5];
          auVar26._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar18[6];
          auVar26._56_8_ = (uVar10 >> 7) * (long)pdVar18[7];
          auVar25 = vaddpd_avx512f(auVar25,auVar26);
          pauVar2 = (undefined1 (*) [64])(local_108.m_data + lVar20 * 8 + uVar19);
          auVar27._0_8_ =
               (ulong)(bVar8 & 1) * auVar25._0_8_ | (ulong)!(bool)(bVar8 & 1) * *(long *)*pauVar2;
          bVar9 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar27._8_8_ = (ulong)bVar9 * auVar25._8_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 8);
          bVar9 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar27._16_8_ =
               (ulong)bVar9 * auVar25._16_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x10);
          bVar9 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar27._24_8_ =
               (ulong)bVar9 * auVar25._24_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x18);
          bVar9 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar27._32_8_ =
               (ulong)bVar9 * auVar25._32_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x20);
          bVar9 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar27._40_8_ =
               (ulong)bVar9 * auVar25._40_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x28);
          bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar27._48_8_ =
               (ulong)bVar9 * auVar25._48_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x30);
          auVar27._56_8_ =
               (uVar10 >> 7) * auVar25._56_8_ |
               (ulong)!SUB81(uVar10 >> 7,0) * *(long *)(*pauVar2 + 0x38);
          *pauVar2 = auVar27;
          uVar19 = uVar19 + 8;
        } while (((long)uVar21 % 8 + 7U & 0xfffffffffffffff8) != uVar19);
      }
      pMVar17 = (p1->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(((long)(p1->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar17 >>
                              3) * -0x5555555555555555));
  }
  arun((rotation_t *)local_a8,(MatrixXd *)&local_108);
  lVar20 = 0x10;
  auVar22._8_8_ = local_e8._0_8_;
  auVar22._0_8_ = local_e8._0_8_;
  auVar22 = vmulpd_avx512vl(local_a8._0_16_,auVar22);
  auVar11._8_8_ = local_e8._8_8_;
  auVar11._0_8_ = local_e8._8_8_;
  auVar22 = vfmadd132pd_avx512vl(stack0xffffffffffffff70,auVar22,auVar11);
  auVar29._8_8_ = local_d8;
  auVar29._0_8_ = local_d8;
  auVar22 = vfmadd231pd_fma(auVar22,auVar29,local_78);
  do {
    uVar12 = *(undefined8 *)(local_b8 + lVar20 + 8);
    uVar5 = *(undefined8 *)(local_a8 + lVar20);
    puVar3 = (undefined8 *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.
                    array + lVar20 + -0x10);
    *puVar3 = *(undefined8 *)(local_b8 + lVar20);
    puVar3[1] = uVar12;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
            m_storage.m_data.array + lVar20) = uVar5;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x58);
  auVar22 = vsubpd_avx(local_c8,auVar22);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array + 9) = auVar22;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
  m_data.array[0xb] =
       local_f0 -
       ((double)local_a8._16_8_ * (double)local_e8._0_8_ +
       local_80 * (double)local_e8._8_8_ + local_d8 * local_68);
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::transformation_t
opengv::math::arun_complete(
    const points_t & p1,
    const points_t & p2 )
{
  assert(p1.size() == p2.size());

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    pointsCenter1 += p1[i];
    pointsCenter2 += p2[i];
  }

  pointsCenter1 = pointsCenter1 / p1.size();
  pointsCenter2 = pointsCenter2 / p2.size();

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < p1.size(); i++ )
  {
    Eigen::Vector3d f = p1[i] - pointsCenter1;
    Eigen::Vector3d fprime = p2[i] - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}